

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O2

void write_var(Context *ctx,Var obj,PropertyId id,Var *var)

{
  char *pcVar1;
  string *src;
  
  if (var->type_ == Name) {
    src = wabt::Var::name_abi_cxx11_(var);
    write_string(ctx,obj,id,src);
    return;
  }
  if (var->type_ == Index) {
    pcVar1 = wabt::Var::index(var,(char *)obj,id);
    write_int64(ctx,obj,id,(ulong)pcVar1 & 0xffffffff);
    return;
  }
  __assert_fail("var->is_name()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                ,0x8b,"void write_var(Context *, Js::Var, PropertyId, const Var *)");
}

Assistant:

void write_var(Context* ctx, Js::Var obj, PropertyId id, const Var* var)
{
    if (var->is_index())
    {
        write_int64(ctx, obj, id, var->index());
    }
    else
    {
        assert(var->is_name());
        write_string(ctx, obj, id, var->name());
    }
}